

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

bool __thiscall
icu_63::DecimalFormat::fastFormatDouble(DecimalFormat *this,double input,UnicodeString *output)

{
  bool isNegative;
  uint uVar1;
  double dVar2;
  UnicodeString *output_local;
  double input_local;
  DecimalFormat *this_local;
  
  if ((this->fields->canUseFastFormat & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = std::isnan(input);
    if (((((uVar1 & 1) != 0) || (dVar2 = trunc(input), dVar2 != input)) || (input <= -2147483648.0))
       || (2147483647.0 < input)) {
      this_local._7_1_ = false;
    }
    else {
      isNegative = std::signbit(input);
      doFastFormatInt32(this,(int)input,isNegative,output);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalFormat::fastFormatDouble(double input, UnicodeString& output) const {
    if (!fields->canUseFastFormat) {
        return false;
    }
    if (std::isnan(input)
            || std::trunc(input) != input
            || input <= INT32_MIN
            || input > INT32_MAX) {
        return false;
    }
    doFastFormatInt32(static_cast<int32_t>(input), std::signbit(input), output);
    return true;
}